

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unpack_template.h
# Opt level: O1

int template_execute(template_context *ctx,char *data,size_t len,size_t *off)

{
  template_stack *ptVar1;
  size_t *psVar2;
  undefined8 *puVar3;
  undefined2 uVar4;
  msgpack_object_type mVar5;
  msgpack_zone *pmVar6;
  char *pcVar7;
  long lVar8;
  ulong uVar9;
  undefined8 uVar10;
  uint64_t uVar11;
  ushort uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  int iVar16;
  int iVar17;
  msgpack_object *pmVar18;
  void *pvVar19;
  uint *puVar20;
  undefined1 uVar21;
  uint uVar22;
  msgpack_object_union *pmVar23;
  msgpack_object **ppmVar24;
  ulong uVar25;
  ulong unaff_RBP;
  uint uVar26;
  ulong uVar27;
  template_stack *ptVar28;
  long lVar29;
  ulong uVar30;
  ulong uVar31;
  msgpack_object *unaff_R12;
  int unaff_R13D;
  msgpack_object_type unaff_R14D;
  ulong unaff_R15;
  msgpack_object *local_88;
  msgpack_object *local_80;
  template_stack *local_68;
  template_stack *local_58;
  
  uVar30 = *off;
  if (len < uVar30) {
    __assert_fail("len >= *off",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/xutiezhu[P]tqapi/lib/msgpack/include/msgpack/unpack_template.h"
                  ,0x5b,
                  "int template_execute(struct template_context *, const char *, size_t, size_t *)")
    ;
  }
  local_88 = (msgpack_object *)(data + uVar30);
  uVar26 = ctx->cs;
  local_58 = (template_stack *)(ulong)ctx->trail;
  uVar22 = ctx->top;
  uVar25 = (ulong)uVar22;
  uVar15 = ctx->trail;
  if (uVar30 == len) {
LAB_0014fc68:
    local_58._0_4_ = uVar15;
    iVar17 = 0;
LAB_00150998:
    ctx->cs = uVar26;
    ctx->trail = (uint)local_58;
    ctx->top = uVar22;
    *off = (long)local_88 - (long)data;
    return iVar17;
  }
  ptVar1 = ctx->stack;
  local_80 = (msgpack_object *)0x0;
  local_68 = ptVar1;
LAB_0014fc90:
  uVar22 = (uint)uVar25;
  pmVar18 = local_88;
  if (uVar26 != 0) goto LAB_0014ffb1;
  uVar21 = (undefined1)local_88->type;
  uVar15 = (uint)(byte)uVar21;
  if (0x7f < uVar15 - 0x80) {
    unaff_RBP = 0;
    if ((char)uVar21 < '\0') {
      iVar17 = -1;
      goto LAB_001509da;
    }
    unaff_R14D = MSGPACK_OBJECT_POSITIVE_INTEGER;
    unaff_R15 = 0;
    local_68 = (template_stack *)(ulong)(byte)uVar21;
LAB_0014ff8d:
    uVar26 = 0;
    goto LAB_0015060e;
  }
  uVar13 = (uint)(byte)uVar21;
  switch(uVar15) {
  case 0x80:
  case 0x81:
  case 0x82:
  case 0x83:
  case 0x84:
  case 0x85:
  case 0x86:
  case 0x87:
  case 0x88:
  case 0x89:
  case 0x8a:
  case 0x8b:
  case 0x8c:
  case 0x8d:
  case 0x8e:
  case 0x8f:
    uVar26 = 0;
    iVar17 = -2;
    if (uVar22 < 0x20) {
      uVar27 = uVar25 & 0xffffffff;
      ptVar1[uVar27].obj.type = MSGPACK_OBJECT_MAP;
      ctx->stack[uVar27].obj.via.array.size = 0;
      uVar9 = (ulong)((uVar13 & 0xf) << 4) * 3;
      pmVar6 = (ctx->user).z;
      uVar30 = (pmVar6->chunk_list).free;
      pcVar7 = (pmVar6->chunk_list).ptr;
      pmVar18 = (msgpack_object *)((ulong)(pcVar7 + 7) & 0xfffffffffffffff8);
      uVar31 = (long)pmVar18 + (uVar9 - (long)pcVar7);
      if (uVar30 < uVar31) {
        pvVar19 = msgpack_zone_malloc_expand(pmVar6,uVar9 | 7);
        pmVar18 = (msgpack_object *)((ulong)pvVar19 & 0xfffffffffffffff8);
      }
      else {
        (pmVar6->chunk_list).free = uVar30 - uVar31;
        (pmVar6->chunk_list).ptr = pcVar7 + uVar31;
      }
      ptVar28 = ptVar1 + uVar27;
      (ptVar28->obj).via.array.ptr = pmVar18;
      iVar17 = -2;
      if (pmVar18 != (msgpack_object *)0x0) {
        if ((local_88->type & (MSGPACK_OBJECT_BIN|MSGPACK_OBJECT_MAP)) == MSGPACK_OBJECT_NIL)
        goto LAB_0014fee1;
        ptVar28->ct = 1;
LAB_0014fecf:
        ptVar28->count = (ulong)((byte)(char)local_88->type & 0xf);
        uVar25 = (ulong)(uVar22 + 1);
        goto LAB_0015077a;
      }
    }
    else {
LAB_001509da:
      uVar26 = 0;
    }
    goto LAB_00150998;
  case 0x90:
  case 0x91:
  case 0x92:
  case 0x93:
  case 0x94:
  case 0x95:
  case 0x96:
  case 0x97:
  case 0x98:
  case 0x99:
  case 0x9a:
  case 0x9b:
  case 0x9c:
  case 0x9d:
  case 0x9e:
  case 0x9f:
    uVar26 = 0;
    iVar17 = -2;
    if (0x1f < uVar22) goto LAB_001509da;
    uVar27 = uVar25 & 0xffffffff;
    ptVar1[uVar27].obj.type = MSGPACK_OBJECT_ARRAY;
    ctx->stack[uVar27].obj.via.array.size = 0;
    uVar9 = (ulong)((uVar13 & 0xf) << 3) * 3;
    pmVar6 = (ctx->user).z;
    uVar30 = (pmVar6->chunk_list).free;
    pcVar7 = (pmVar6->chunk_list).ptr;
    pmVar18 = (msgpack_object *)((ulong)(pcVar7 + 7) & 0xfffffffffffffff8);
    uVar31 = (long)pmVar18 + (uVar9 - (long)pcVar7);
    if (uVar30 < uVar31) {
      pvVar19 = msgpack_zone_malloc_expand(pmVar6,uVar9 | 7);
      pmVar18 = (msgpack_object *)((ulong)pvVar19 & 0xfffffffffffffff8);
    }
    else {
      (pmVar6->chunk_list).free = uVar30 - uVar31;
      (pmVar6->chunk_list).ptr = pcVar7 + uVar31;
    }
    ptVar28 = ptVar1 + uVar27;
    (ptVar28->obj).via.array.ptr = pmVar18;
    iVar17 = -2;
    if (pmVar18 != (msgpack_object *)0x0) {
      if ((local_88->type & (MSGPACK_OBJECT_BIN|MSGPACK_OBJECT_MAP)) != MSGPACK_OBJECT_NIL) {
        ptVar28->ct = 0;
        goto LAB_0014fecf;
      }
LAB_0014fee1:
      unaff_R14D = (ptVar28->obj).type;
      unaff_R13D = *(int *)&(ptVar28->obj).field_0x4;
      local_68 = (template_stack *)(ptVar28->obj).via.u64;
      unaff_RBP = (ulong)local_68 >> 0x20;
      uVar26 = 0;
      unaff_R12 = (ptVar28->obj).via.array.ptr;
      unaff_R15 = (ulong)local_68 >> 8 & 0xffffff;
      break;
    }
    goto LAB_00150998;
  default:
    uVar15 = uVar13 & 0x1f;
    if ((uVar21 & 0x1f) != MSGPACK_OBJECT_NIL) {
LAB_0014ff9b:
      uVar13 = 0x20;
switchD_0014fffd_caseD_14:
      uVar26 = uVar13;
      local_58 = (template_stack *)(ulong)uVar15;
      pmVar18 = (msgpack_object *)((long)&local_88->type + 1);
LAB_0014ffb1:
      local_80 = pmVar18;
      local_88 = local_80;
      uVar15 = (uint)local_58;
      if ((undefined1 *)((long)(data + len) - (long)local_80) < local_58) goto LAB_0014fc68;
      local_88 = (msgpack_object *)((long)&local_80->type + (ulong)((uint)local_58 - 1));
      uVar15 = 2;
      uVar13 = 0x22;
      switch(uVar26) {
      case 4:
        uVar15 = (uint)(byte)(char)local_80->type;
        if (uVar15 == 0) {
          local_68 = (template_stack *)0x0;
          uVar26 = 4;
          goto LAB_001505ef;
        }
        uVar13 = 0x21;
        goto switchD_0014fffd_caseD_14;
      case 5:
        uVar4 = (undefined2)local_80->type;
        uVar12 = uVar4 << 8 | (ushort)uVar4 >> 8;
        uVar14 = (uint)uVar12;
        uVar15 = (uint)uVar12;
        uVar13 = 0x21;
        if (uVar4 == MSGPACK_OBJECT_NIL) {
          uVar26 = 5;
          goto LAB_00150181;
        }
        goto switchD_0014fffd_caseD_14;
      case 6:
        mVar5 = local_80->type;
        uVar15 = mVar5 >> 0x18 | (mVar5 & 0xff0000) >> 8 | (mVar5 & 0xff00) << 8 | mVar5 << 0x18;
        uVar13 = 0x21;
        if (mVar5 == MSGPACK_OBJECT_NIL) {
          uVar26 = 6;
          uVar14 = uVar15;
LAB_00150181:
          local_68 = (template_stack *)(ulong)uVar14;
          goto LAB_001505ef;
        }
        goto switchD_0014fffd_caseD_14;
      case 7:
        uVar15 = (uint)(byte)(char)local_80->type;
        goto LAB_00150152;
      case 8:
        uVar4 = (undefined2)local_80->type;
        uVar15 = (uint)(ushort)(uVar4 << 8 | (ushort)uVar4 >> 8);
LAB_00150152:
        uVar15 = uVar15 + 1;
        uVar13 = 0x22;
        goto switchD_0014fffd_caseD_14;
      case 9:
        mVar5 = local_80->type;
        uVar15 = (mVar5 >> 0x18 | (mVar5 & 0xff0000) >> 8 | (mVar5 & 0xff00) << 8 | mVar5 << 0x18) +
                 1;
        local_58 = (template_stack *)(ulong)uVar15;
        uVar13 = 0x22;
        if (uVar15 == 0) {
          uVar26 = 9;
          goto LAB_0015032d;
        }
        goto switchD_0014fffd_caseD_14;
      case 10:
        mVar5 = local_80->type;
        local_68 = (template_stack *)
                   (double)(float)(mVar5 >> 0x18 | (mVar5 & 0xff0000) >> 8 | (mVar5 & 0xff00) << 8 |
                                  mVar5 << 0x18);
        unaff_R15 = (ulong)local_68 >> 8 & 0xffffff;
        unaff_RBP = (ulong)local_68 >> 0x20;
        unaff_R14D = MSGPACK_OBJECT_FLOAT32;
        uVar26 = 10;
        goto LAB_0015060e;
      case 0xb:
        uVar30 = *(ulong *)local_80;
        uVar9 = uVar30 >> 0x38 | (uVar30 & 0xff000000000000) >> 0x28 |
                (uVar30 & 0xff0000000000) >> 0x18 | (uVar30 & 0xff00000000) >> 8;
        local_68 = (template_stack *)
                   (uVar9 | (uVar30 & 0xff000000) << 8 | (uVar30 & 0xff0000) << 0x18 |
                    (uVar30 & 0xff00) << 0x28 | uVar30 << 0x38);
        unaff_R15 = uVar9 >> 8;
        unaff_RBP = (ulong)local_68 >> 0x20;
        uVar26 = 0xb;
        unaff_R14D = MSGPACK_OBJECT_FLOAT;
        goto LAB_0015060e;
      case 0xc:
        local_68 = (template_stack *)(ulong)(byte)(char)local_80->type;
        uVar26 = 0xc;
        unaff_R15 = 0;
        goto LAB_00150321;
      case 0xd:
        uVar4 = (undefined2)local_80->type;
        local_68 = (template_stack *)(ulong)((ushort)uVar4 >> 8);
        unaff_R15 = (ulong)(ushort)(uVar4 & 0xff);
        uVar26 = 0xd;
        goto LAB_00150321;
      case 0xe:
        mVar5 = local_80->type;
        uVar26 = mVar5 >> 0x18 | (mVar5 & 0xff0000) >> 8 | (mVar5 & 0xff00) << 8 | mVar5 << 0x18;
        local_68 = (template_stack *)(ulong)uVar26;
        unaff_R15 = (ulong)(uVar26 >> 8);
        uVar26 = 0xe;
LAB_00150321:
        unaff_R14D = MSGPACK_OBJECT_POSITIVE_INTEGER;
        unaff_RBP = 0;
        goto LAB_0015060e;
      case 0xf:
        uVar30 = *(ulong *)local_80;
        uVar9 = uVar30 >> 0x38 | (uVar30 & 0xff000000000000) >> 0x28 |
                (uVar30 & 0xff0000000000) >> 0x18 | (uVar30 & 0xff00000000) >> 8;
        local_68 = (template_stack *)
                   (uVar9 | (uVar30 & 0xff000000) << 8 | (uVar30 & 0xff0000) << 0x18 |
                    (uVar30 & 0xff00) << 0x28 | uVar30 << 0x38);
        unaff_R15 = uVar9 >> 8;
        unaff_RBP = (ulong)local_68 >> 0x20;
        uVar26 = 0xf;
        unaff_R14D = MSGPACK_OBJECT_POSITIVE_INTEGER;
        goto LAB_0015060e;
      case 0x10:
        uVar21 = (undefined1)local_80->type;
        uVar26 = 0x10;
        local_68 = (template_stack *)(ulong)(byte)uVar21;
        goto LAB_0015009b;
      case 0x11:
        uVar4 = (undefined2)local_80->type;
        uVar12 = uVar4 << 8 | (ushort)uVar4 >> 8;
        uVar22 = (uint)(short)uVar12;
        local_68 = (template_stack *)(ulong)uVar22;
        uVar26 = (int)uVar22 >> 8;
        if (-1 < (short)uVar12) {
          uVar26 = (uint)(ushort)(uVar4 & 0xff);
        }
        unaff_R15 = (ulong)uVar26;
        unaff_RBP = (ulong)(uint)((int)uVar22 >> 0xf);
        unaff_R14D = (ushort)(uVar4 << 8) >> 0xf | MSGPACK_OBJECT_POSITIVE_INTEGER;
        uVar26 = 0x11;
        goto LAB_0015060e;
      case 0x12:
        mVar5 = local_80->type;
        uVar26 = mVar5 >> 0x18 | (mVar5 & 0xff0000) >> 8 | (mVar5 & 0xff00) << 8 | mVar5 << 0x18;
        local_68 = (template_stack *)(ulong)uVar26;
        unaff_RBP = (ulong)(uint)((int)uVar26 >> 0x1f);
        unaff_R14D = (mVar5 << 0x18) >> 0x1f | MSGPACK_OBJECT_POSITIVE_INTEGER;
        unaff_R15 = (ulong)(uVar26 >> 8);
        uVar26 = 0x12;
        goto LAB_0015060e;
      case 0x13:
        uVar30 = *(ulong *)local_80;
        uVar9 = uVar30 >> 0x38 | (uVar30 & 0xff000000000000) >> 0x28 |
                (uVar30 & 0xff0000000000) >> 0x18 | (uVar30 & 0xff00000000) >> 8;
        local_68 = (template_stack *)
                   (uVar9 | (uVar30 & 0xff000000) << 8 | (uVar30 & 0xff0000) << 0x18 |
                    (uVar30 & 0xff00) << 0x28 | uVar30 << 0x38);
        unaff_R14D = -1 < (long)local_68 ^ MSGPACK_OBJECT_NEGATIVE_INTEGER;
        unaff_RBP = (ulong)local_68 >> 0x20;
        unaff_R15 = uVar9 >> 8;
        uVar26 = 0x13;
        goto LAB_0015060e;
      case 0x14:
        goto switchD_0014fffd_caseD_14;
      case 0x15:
        uVar15 = 3;
        goto switchD_0014fffd_caseD_14;
      case 0x16:
        uVar15 = 5;
        goto switchD_0014fffd_caseD_14;
      case 0x17:
        uVar15 = 9;
        goto switchD_0014fffd_caseD_14;
      case 0x18:
switchD_0014fffd_caseD_18:
        uVar15 = 0x11;
        uVar13 = 0x22;
        goto switchD_0014fffd_caseD_14;
      case 0x19:
        goto switchD_0014fffd_caseD_19;
      case 0x1a:
        uVar4 = (undefined2)local_80->type;
        uVar15 = (uint)(ushort)(uVar4 << 8 | (ushort)uVar4 >> 8);
        uVar13 = 0x20;
        if (uVar4 == MSGPACK_OBJECT_NIL) {
          uVar26 = 0x1a;
          ptVar28 = (template_stack *)(ulong)uVar15;
          goto LAB_00150244;
        }
        goto switchD_0014fffd_caseD_14;
      case 0x1b:
        mVar5 = local_80->type;
        uVar15 = mVar5 >> 0x18 | (mVar5 & 0xff0000) >> 8 | (mVar5 & 0xff00) << 8 | mVar5 << 0x18;
        uVar26 = (uint)(mVar5 != MSGPACK_OBJECT_NIL) * 5 + 0x1b;
        ptVar28 = (template_stack *)(ulong)uVar15;
        uVar13 = uVar26;
        if (mVar5 == MSGPACK_OBJECT_NIL) goto LAB_00150244;
        goto switchD_0014fffd_caseD_14;
      case 0x1c:
        iVar17 = -2;
        iVar16 = 7;
        if (uVar22 < 0x20) {
          uVar4 = (undefined2)local_80->type;
          uVar12 = uVar4 << 8 | (ushort)uVar4 >> 8;
          pmVar18 = &ptVar1[uVar25 & 0xffffffff].obj;
          iVar17 = template_callback_array(&ctx->user,(uint)uVar12,pmVar18);
          if (iVar17 < 0) {
            iVar16 = 7;
          }
          else {
            if (uVar4 == MSGPACK_OBJECT_NIL) {
              unaff_R14D = pmVar18->type;
              unaff_R13D = *(int *)&pmVar18->field_0x4;
              local_68 = (template_stack *)(pmVar18->via).u64;
              unaff_R15 = (ulong)local_68 >> 8 & 0xffffff;
              unaff_RBP = (ulong)local_68 >> 0x20;
              unaff_R12 = (pmVar18->via).array.ptr;
              iVar16 = 8;
            }
            else {
              pmVar18[1].via.array.size = 0;
              *(ulong *)(pmVar18 + 1) = (ulong)uVar12;
              uVar25 = (ulong)(uVar22 + 1);
              iVar16 = 0xd;
            }
            iVar17 = 0;
          }
        }
        uVar26 = 0x1c;
        break;
      case 0x1d:
        iVar17 = -2;
        iVar16 = 7;
        if (uVar22 < 0x20) {
          mVar5 = local_80->type;
          uVar26 = mVar5 >> 0x18 | (mVar5 & 0xff0000) >> 8 | (mVar5 & 0xff00) << 8 | mVar5 << 0x18;
          pmVar18 = &ptVar1[uVar25 & 0xffffffff].obj;
          iVar17 = template_callback_array(&ctx->user,uVar26,pmVar18);
          if (iVar17 < 0) {
            iVar16 = 7;
          }
          else {
            if (mVar5 == MSGPACK_OBJECT_NIL) {
              unaff_R14D = pmVar18->type;
              unaff_R13D = *(int *)&pmVar18->field_0x4;
              local_68 = (template_stack *)(pmVar18->via).u64;
              unaff_R15 = (ulong)local_68 >> 8 & 0xffffff;
              unaff_RBP = (ulong)local_68 >> 0x20;
              unaff_R12 = (pmVar18->via).array.ptr;
              iVar16 = 8;
            }
            else {
              pmVar18[1].via.array.size = 0;
              *(ulong *)(pmVar18 + 1) = (ulong)uVar26;
              uVar25 = (ulong)(uVar22 + 1);
              iVar16 = 0xd;
            }
            iVar17 = 0;
          }
        }
        uVar26 = 0x1d;
        break;
      case 0x1e:
        iVar17 = -2;
        iVar16 = 7;
        if (uVar22 < 0x20) {
          uVar4 = (undefined2)local_80->type;
          uVar12 = uVar4 << 8 | (ushort)uVar4 >> 8;
          pmVar18 = &ptVar1[uVar25 & 0xffffffff].obj;
          iVar17 = template_callback_map(&ctx->user,(uint)uVar12,pmVar18);
          if (iVar17 < 0) {
            iVar16 = 7;
          }
          else {
            if (uVar4 == MSGPACK_OBJECT_NIL) {
              unaff_R14D = pmVar18->type;
              unaff_R13D = *(int *)&pmVar18->field_0x4;
              local_68 = (template_stack *)(pmVar18->via).u64;
              unaff_R15 = (ulong)local_68 >> 8 & 0xffffff;
              unaff_RBP = (ulong)local_68 >> 0x20;
              unaff_R12 = (pmVar18->via).array.ptr;
              iVar16 = 8;
            }
            else {
              pmVar18[1].via.array.size = 1;
              *(ulong *)(pmVar18 + 1) = (ulong)uVar12;
              uVar25 = (ulong)(uVar22 + 1);
              iVar16 = 0xd;
            }
            iVar17 = 0;
          }
        }
        uVar26 = 0x1e;
        break;
      case 0x1f:
        iVar17 = -2;
        iVar16 = 7;
        if (uVar22 < 0x20) {
          mVar5 = local_80->type;
          uVar26 = mVar5 >> 0x18 | (mVar5 & 0xff0000) >> 8 | (mVar5 & 0xff00) << 8 | mVar5 << 0x18;
          pmVar18 = &ptVar1[uVar25 & 0xffffffff].obj;
          iVar17 = template_callback_map(&ctx->user,uVar26,pmVar18);
          if (iVar17 < 0) {
            iVar16 = 7;
          }
          else {
            if (mVar5 == MSGPACK_OBJECT_NIL) {
              unaff_R14D = pmVar18->type;
              unaff_R13D = *(int *)&pmVar18->field_0x4;
              local_68 = (template_stack *)(pmVar18->via).u64;
              unaff_R15 = (ulong)local_68 >> 8 & 0xffffff;
              unaff_RBP = (ulong)local_68 >> 0x20;
              unaff_R12 = (pmVar18->via).array.ptr;
              iVar16 = 8;
            }
            else {
              pmVar18[1].via.array.size = 1;
              *(ulong *)(pmVar18 + 1) = (ulong)uVar26;
              uVar25 = (ulong)(uVar22 + 1);
              iVar16 = 0xd;
            }
            iVar17 = 0;
          }
        }
        uVar26 = 0x1f;
        break;
      case 0x20:
        ptVar28 = local_58;
        goto LAB_00150244;
      case 0x21:
        local_68 = local_58;
LAB_001505ef:
        (ctx->user).referenced = true;
        unaff_R14D = MSGPACK_OBJECT_BIN;
        unaff_R12 = local_80;
        unaff_R15 = (ulong)local_68 >> 8;
        local_58 = local_68;
        goto LAB_0015060e;
      case 0x22:
LAB_0015032d:
        iVar16 = (int)local_58;
        if (iVar16 == 0) {
          iVar17 = -1;
        }
        else {
          local_68 = (template_stack *)(ulong)(byte)(char)local_80->type;
          unaff_R12 = (msgpack_object *)((long)&local_80->type + 1);
          unaff_RBP = (ulong)(iVar16 - 1);
          (ctx->user).referenced = true;
          iVar17 = 0;
          unaff_R14D = MSGPACK_OBJECT_EXT;
        }
        local_68 = (template_stack *)((ulong)local_68 & 0xffffffff);
        if (iVar16 != 0) goto LAB_0015060e;
        local_58._0_4_ = 0;
        goto LAB_00150998;
      default:
        goto switchD_0014fffd_default;
      }
      uVar22 = (uint)uVar25;
      if (iVar16 == 8) break;
      if (iVar16 == 0xd) goto LAB_0015077a;
      if (iVar16 != 7) {
        return iVar17;
      }
      goto LAB_00150998;
    }
    uVar26 = 0;
    ptVar28 = (template_stack *)0x0;
    goto LAB_00150244;
  case 0xc0:
  case 0xc1:
  case 0xc2:
  case 0xc3:
  case 0xc4:
  case 0xc5:
  case 0xc6:
  case 199:
  case 200:
  case 0xc9:
  case 0xca:
  case 0xcb:
  case 0xcc:
  case 0xcd:
  case 0xce:
  case 0xcf:
  case 0xd0:
  case 0xd1:
  case 0xd2:
  case 0xd3:
  case 0xd4:
  case 0xd5:
  case 0xd6:
  case 0xd7:
  case 0xd8:
  case 0xd9:
  case 0xda:
  case 0xdb:
  case 0xdc:
  case 0xdd:
  case 0xde:
  case 0xdf:
    uVar26 = 0;
    switch(uVar15) {
    case 0xc0:
      unaff_R14D = MSGPACK_OBJECT_NIL;
      goto LAB_0015060e;
    default:
switchD_0014fffd_default:
      uVar22 = (uint)uVar25;
      iVar17 = -1;
      goto LAB_00150998;
    case 0xc2:
      local_68 = (template_stack *)0x0;
      unaff_R14D = MSGPACK_OBJECT_BOOLEAN;
      goto LAB_0014ff8d;
    case 0xc3:
      unaff_R14D = MSGPACK_OBJECT_BOOLEAN;
      local_68 = (template_stack *)0x1;
      goto LAB_0015060e;
    case 0xc4:
    case 0xc5:
    case 0xc6:
      uVar21 = uVar21 & MSGPACK_OBJECT_NEGATIVE_INTEGER;
      iVar17 = 1;
      break;
    case 199:
    case 200:
    case 0xc9:
      uVar21 = uVar21 + MSGPACK_OBJECT_BOOLEAN & MSGPACK_OBJECT_NEGATIVE_INTEGER;
      iVar17 = 1;
      break;
    case 0xca:
    case 0xcb:
    case 0xcc:
    case 0xcd:
    case 0xce:
    case 0xcf:
    case 0xd0:
    case 0xd1:
    case 0xd2:
    case 0xd3:
      uVar21 = uVar21 & MSGPACK_OBJECT_NEGATIVE_INTEGER;
      goto LAB_0014ff46;
    case 0xd4:
    case 0xd5:
    case 0xd6:
    case 0xd7:
      uVar15 = 1 << (uVar21 & MSGPACK_OBJECT_NEGATIVE_INTEGER);
      goto LAB_00150152;
    case 0xd8:
      goto switchD_0014fffd_caseD_18;
    case 0xd9:
    case 0xda:
    case 0xdb:
      uVar21 = (uVar21 & MSGPACK_OBJECT_NEGATIVE_INTEGER) - MSGPACK_OBJECT_BOOLEAN;
LAB_0014ff46:
      iVar17 = 1;
      break;
    case 0xdc:
    case 0xdd:
    case 0xde:
    case 0xdf:
      uVar21 = uVar21 & MSGPACK_OBJECT_BOOLEAN;
      iVar17 = 2;
    }
    uVar15 = iVar17 << (uVar21 & 0x1f);
    uVar13 = uVar13 & 0x1f;
    goto switchD_0014fffd_caseD_14;
  case 0xe0:
  case 0xe1:
  case 0xe2:
  case 0xe3:
  case 0xe4:
  case 0xe5:
  case 0xe6:
  case 0xe7:
  case 0xe8:
  case 0xe9:
  case 0xea:
  case 0xeb:
  case 0xec:
  case 0xed:
  case 0xee:
  case 0xef:
  case 0xf0:
  case 0xf1:
  case 0xf2:
  case 0xf3:
  case 0xf4:
  case 0xf5:
  case 0xf6:
  case 0xf7:
  case 0xf8:
  case 0xf9:
  case 0xfa:
  case 0xfb:
  case 0xfc:
  case 0xfd:
  case 0xfe:
  case 0xff:
    uVar26 = 0;
    local_68 = (template_stack *)(ulong)(byte)uVar21;
LAB_0015009b:
    unaff_R14D = (byte)uVar21 >> 7 | MSGPACK_OBJECT_POSITIVE_INTEGER;
    unaff_RBP = (ulong)(uint)(int)((char)uVar21 >> 7);
    unaff_R15 = unaff_RBP;
  }
LAB_0015060e:
  iVar17 = (int)unaff_R15;
  if ((int)uVar25 != 0) {
    uVar25 = uVar25 & 0xffffffff;
    puVar20 = &ctx->stack[uVar25 - 1].ct;
    do {
      uVar22 = *puVar20;
      iVar17 = (int)unaff_R15;
      if (uVar22 == 0) {
        lVar8 = *(long *)(puVar20 + -4);
        uVar30 = (ulong)(((msgpack_object_union *)(puVar20 + -6))->array).size;
        *(msgpack_object_type *)(lVar8 + uVar30 * 0x18) = unaff_R14D;
        *(int *)(lVar8 + 4 + uVar30 * 0x18) = unaff_R13D;
        *(ulong *)(lVar8 + 8 + uVar30 * 0x18) =
             unaff_RBP << 0x20 | (ulong)local_68 & 0xff | (ulong)(uint)(iVar17 << 8);
        *(msgpack_object **)(lVar8 + 0x10 + uVar30 * 0x18) = unaff_R12;
        (((msgpack_object_union *)(puVar20 + -6))->array).size =
             (((msgpack_object_union *)(puVar20 + -6))->array).size + 1;
        psVar2 = (size_t *)(puVar20 + -2);
        *psVar2 = *psVar2 - 1;
        if (*psVar2 != 0) goto LAB_0015077a;
        pmVar23 = &ptVar1[uVar25 - 1].obj.via;
        ppmVar24 = &ptVar1[uVar25 - 1].obj.via.array.ptr;
      }
      else {
        if (uVar22 != 2) {
          if (uVar22 != 1) goto switchD_0014fffd_default;
          ((msgpack_object *)(puVar20 + 2))->type = unaff_R14D;
          puVar20[3] = unaff_R13D;
          ((msgpack_object_union *)(puVar20 + 4))->u64 =
               unaff_RBP << 0x20 | (ulong)local_68 & 0xff | (ulong)(uint)(iVar17 << 8);
          *(msgpack_object **)(puVar20 + 6) = unaff_R12;
          *puVar20 = 2;
          goto LAB_0015077a;
        }
        lVar8 = *(long *)(puVar20 + -4);
        lVar29 = (ulong)(((msgpack_object_union *)(puVar20 + -6))->array).size * 0x30;
        uVar10 = *(undefined8 *)(puVar20 + 2);
        uVar11 = ((msgpack_object_union *)(puVar20 + 4))->u64;
        *(undefined8 *)(lVar8 + 0x10 + lVar29) = *(undefined8 *)(puVar20 + 6);
        puVar3 = (undefined8 *)(lVar8 + lVar29);
        *puVar3 = uVar10;
        puVar3[1] = uVar11;
        lVar8 = *(long *)(puVar20 + -4);
        lVar29 = (ulong)(((msgpack_object_union *)(puVar20 + -6))->array).size * 0x30;
        *(msgpack_object_type *)(lVar8 + 0x18 + lVar29) = unaff_R14D;
        *(int *)(lVar8 + 0x1c + lVar29) = unaff_R13D;
        *(ulong *)(lVar8 + 0x20 + lVar29) =
             unaff_RBP << 0x20 | (ulong)local_68 & 0xff | (ulong)(uint)(iVar17 << 8);
        *(msgpack_object **)(lVar8 + 0x28 + lVar29) = unaff_R12;
        (((msgpack_object_union *)(puVar20 + -6))->array).size =
             (((msgpack_object_union *)(puVar20 + -6))->array).size + 1;
        psVar2 = (size_t *)(puVar20 + -2);
        *psVar2 = *psVar2 - 1;
        if (*psVar2 != 0) goto LAB_00150765;
        pmVar23 = (msgpack_object_union *)(puVar20 + -6);
        ppmVar24 = (msgpack_object **)(puVar20 + -4);
      }
      unaff_R14D = (((template_stack *)(puVar20 + -8))->obj).type;
      unaff_R13D = puVar20[-7];
      unaff_R12 = *ppmVar24;
      local_68 = (template_stack *)pmVar23->u64;
      unaff_RBP = (ulong)local_68 >> 0x20;
      unaff_R15 = (ulong)local_68 >> 8 & 0xffffff;
      iVar17 = (int)unaff_R15;
      puVar20 = puVar20 + -0x10;
      uVar25 = uVar25 - 1;
      if (uVar25 == 0) break;
    } while( true );
  }
  ctx->stack[0].obj.type = unaff_R14D;
  *(int *)&ctx->stack[0].obj.field_0x4 = unaff_R13D;
  ctx->stack[0].obj.via.u64 =
       unaff_RBP << 0x20 | (ulong)local_68 & 0xff | (ulong)(uint)(iVar17 << 8);
  ctx->stack[0].obj.via.array.ptr = unaff_R12;
  local_88 = (msgpack_object *)((long)&local_88->type + 1);
  uVar22 = 0;
  iVar17 = 1;
  goto LAB_00150998;
switchD_0014fffd_caseD_19:
  uVar21 = (undefined1)local_80->type;
  uVar15 = (uint)(byte)uVar21;
  if (uVar21 == MSGPACK_OBJECT_NIL) goto code_r0x001501aa;
  goto LAB_0014ff9b;
code_r0x001501aa:
  uVar26 = 0x19;
  ptVar28 = (template_stack *)0x0;
LAB_00150244:
  local_68 = ptVar28;
  (ctx->user).referenced = true;
  unaff_R14D = MSGPACK_OBJECT_STR;
  unaff_R12 = local_80;
  unaff_R15 = (ulong)local_68 >> 8;
  local_58 = local_68;
  goto LAB_0015060e;
LAB_00150765:
  *puVar20 = 1;
LAB_0015077a:
  uVar22 = (uint)uVar25;
  local_88 = (msgpack_object *)((long)&local_88->type + 1);
  uVar26 = 0;
  iVar17 = 0;
  if (local_88 == (msgpack_object *)(data + len)) goto LAB_00150998;
  goto LAB_0014fc90;
}

Assistant:

msgpack_unpack_func(int, _execute)(msgpack_unpack_struct(_context)* ctx, const char* data, size_t len, size_t* off)
{
    assert(len >= *off);
    {
        const unsigned char* p = (unsigned char*)data + *off;
        const unsigned char* const pe = (unsigned char*)data + len;
        const void* n = NULL;

        unsigned int trail = ctx->trail;
        unsigned int cs = ctx->cs;
        unsigned int top = ctx->top;
        msgpack_unpack_struct(_stack)* stack = ctx->stack;
        /*
        unsigned int stack_size = ctx->stack_size;
        */
        msgpack_unpack_user* user = &ctx->user;

        msgpack_unpack_object obj;
        msgpack_unpack_struct(_stack)* c = NULL;

        int ret;

#define push_simple_value(func) \
        ret = msgpack_unpack_callback(func)(user, &obj); \
        if(ret < 0) { goto _failed; } \
        goto _push
#define push_fixed_value(func, arg) \
        ret = msgpack_unpack_callback(func)(user, arg, &obj); \
        if(ret < 0) { goto _failed; } \
        goto _push
#define push_variable_value(func, base, pos, len) \
        ret = msgpack_unpack_callback(func)(user, \
            (const char*)base, (const char*)pos, len, &obj); \
        if(ret < 0) { goto _failed; } \
        goto _push

#define again_fixed_trail(_cs, trail_len) \
        trail = trail_len; \
        cs = _cs; \
        goto _fixed_trail_again
#define again_fixed_trail_if_zero(_cs, trail_len, ifzero) \
        trail = trail_len; \
        if(trail == 0) { goto ifzero; } \
        cs = _cs; \
        goto _fixed_trail_again

#define start_container(func, count_, ct_) \
        if(top >= MSGPACK_EMBED_STACK_SIZE) { \
            ret = MSGPACK_UNPACK_NOMEM_ERROR; \
            goto _failed; \
        } /* FIXME */ \
        ret = msgpack_unpack_callback(func)(user, count_, &stack[top].obj); \
        if(ret < 0) { goto _failed; } \
        if((count_) == 0) { obj = stack[top].obj; goto _push; } \
        stack[top].ct = ct_; \
        stack[top].count = count_; \
        ++top; \
        goto _header_again

#define NEXT_CS(p) \
        ((unsigned int)*p & 0x1f)

#ifdef USE_CASE_RANGE
#define SWITCH_RANGE_BEGIN     switch(*p) {
#define SWITCH_RANGE(FROM, TO) case FROM ... TO:
#define SWITCH_RANGE_DEFAULT   default:
#define SWITCH_RANGE_END       }
#else
#define SWITCH_RANGE_BEGIN     { if(0) {
#define SWITCH_RANGE(FROM, TO) } else if(FROM <= *p && *p <= TO) {
#define SWITCH_RANGE_DEFAULT   } else {
#define SWITCH_RANGE_END       } }
#endif

        if(p == pe) { goto _out; }
        do {
            switch(cs) {
            case MSGPACK_CS_HEADER:
                SWITCH_RANGE_BEGIN
                SWITCH_RANGE(0x00, 0x7f)  // Positive Fixnum
                    push_fixed_value(_uint8, *(uint8_t*)p);
                SWITCH_RANGE(0xe0, 0xff)  // Negative Fixnum
                    push_fixed_value(_int8, *(int8_t*)p);
                SWITCH_RANGE(0xc0, 0xdf)  // Variable
                    switch(*p) {
                    case 0xc0:  // nil
                        push_simple_value(_nil);
                    //case 0xc1:  // string
                    //  again_terminal_trail(NEXT_CS(p), p+1);
                    case 0xc2:  // false
                        push_simple_value(_false);
                    case 0xc3:  // true
                        push_simple_value(_true);
                    case 0xc4: // bin 8
                    case 0xc5: // bin 16
                    case 0xc6: // bin 32
                        again_fixed_trail(NEXT_CS(p), 1 << (((unsigned int)*p) & 0x03));
                    case 0xc7: // ext 8
                    case 0xc8: // ext 16
                    case 0xc9: // ext 32
                        again_fixed_trail(NEXT_CS(p), 1 << ((((unsigned int)*p) + 1) & 0x03));
                    case 0xca:  // float
                    case 0xcb:  // double
                    case 0xcc:  // unsigned int  8
                    case 0xcd:  // unsigned int 16
                    case 0xce:  // unsigned int 32
                    case 0xcf:  // unsigned int 64
                    case 0xd0:  // signed int  8
                    case 0xd1:  // signed int 16
                    case 0xd2:  // signed int 32
                    case 0xd3:  // signed int 64
                        again_fixed_trail(NEXT_CS(p), 1 << (((unsigned int)*p) & 0x03));
                    case 0xd4:  // fixext 1
                    case 0xd5:  // fixext 2
                    case 0xd6:  // fixext 4
                    case 0xd7:  // fixext 8
                        again_fixed_trail_if_zero(MSGPACK_ACS_EXT_VALUE,
                            (1 << (((unsigned int)*p) & 0x03)) + 1, _ext_zero);
                    case 0xd8:  // fixext 16
                        again_fixed_trail_if_zero(MSGPACK_ACS_EXT_VALUE, 16+1, _ext_zero);

                    case 0xd9:  // str 8
                    case 0xda:  // str 16
                    case 0xdb:  // str 32
                        again_fixed_trail(NEXT_CS(p), 1 << ((((unsigned int)*p) & 0x03) - 1));
                    case 0xdc:  // array 16
                    case 0xdd:  // array 32
                    case 0xde:  // map 16
                    case 0xdf:  // map 32
                        again_fixed_trail(NEXT_CS(p), 2u << (((unsigned int)*p) & 0x01));
                    default:
                        ret = MSGPACK_UNPACK_PARSE_ERROR;
                        goto _failed;
                    }
                SWITCH_RANGE(0xa0, 0xbf)  // FixStr
                    again_fixed_trail_if_zero(MSGPACK_ACS_STR_VALUE, ((unsigned int)*p & 0x1f), _str_zero);
                SWITCH_RANGE(0x90, 0x9f)  // FixArray
                    start_container(_array, ((unsigned int)*p) & 0x0f, MSGPACK_CT_ARRAY_ITEM);
                SWITCH_RANGE(0x80, 0x8f)  // FixMap
                    start_container(_map, ((unsigned int)*p) & 0x0f, MSGPACK_CT_MAP_KEY);

                SWITCH_RANGE_DEFAULT
                    ret = MSGPACK_UNPACK_PARSE_ERROR;
                    goto _failed;
                SWITCH_RANGE_END
                // end MSGPACK_CS_HEADER


            _fixed_trail_again:
                ++p;

            default:
                if((size_t)(pe - p) < trail) { goto _out; }
                n = p;  p += trail - 1;
                switch(cs) {
                //case MSGPACK_CS_
                //case MSGPACK_CS_
                case MSGPACK_CS_FLOAT: {
                        union { uint32_t i; float f; } mem;
                        _msgpack_load32(uint32_t, n, &mem.i);
                        push_fixed_value(_float, mem.f); }
                case MSGPACK_CS_DOUBLE: {
                        union { uint64_t i; double f; } mem;
                        _msgpack_load64(uint64_t, n, &mem.i);
#if defined(TARGET_OS_IPHONE)
                    // ok
#elif defined(__arm__) && !(__ARM_EABI__) // arm-oabi
                        // https://github.com/msgpack/msgpack-perl/pull/1
                        mem.i = (mem.i & 0xFFFFFFFFUL) << 32UL | (mem.i >> 32UL);
#endif
                        push_fixed_value(_double, mem.f); }
                case MSGPACK_CS_UINT_8:
                    push_fixed_value(_uint8, *(uint8_t*)n);
                case MSGPACK_CS_UINT_16:{
                    uint16_t tmp;
                    _msgpack_load16(uint16_t,n,&tmp);
                    push_fixed_value(_uint16, tmp);
                }
                case MSGPACK_CS_UINT_32:{
                    uint32_t tmp;
                    _msgpack_load32(uint32_t,n,&tmp);
                    push_fixed_value(_uint32, tmp);
                }
                case MSGPACK_CS_UINT_64:{
                    uint64_t tmp;
                    _msgpack_load64(uint64_t,n,&tmp);
                    push_fixed_value(_uint64, tmp);
                }
                case MSGPACK_CS_INT_8:
                    push_fixed_value(_int8, *(int8_t*)n);
                case MSGPACK_CS_INT_16:{
                    int16_t tmp;
                    _msgpack_load16(int16_t,n,&tmp);
                    push_fixed_value(_int16, tmp);
                }
                case MSGPACK_CS_INT_32:{
                    int32_t tmp;
                    _msgpack_load32(int32_t,n,&tmp);
                    push_fixed_value(_int32, tmp);
                }
                case MSGPACK_CS_INT_64:{
                    int64_t tmp;
                    _msgpack_load64(int64_t,n,&tmp);
                    push_fixed_value(_int64, tmp);
                }
                case MSGPACK_CS_FIXEXT_1:
                    again_fixed_trail_if_zero(MSGPACK_ACS_EXT_VALUE, 1+1, _ext_zero);
                case MSGPACK_CS_FIXEXT_2:
                    again_fixed_trail_if_zero(MSGPACK_ACS_EXT_VALUE, 2+1, _ext_zero);
                case MSGPACK_CS_FIXEXT_4:
                    again_fixed_trail_if_zero(MSGPACK_ACS_EXT_VALUE, 4+1, _ext_zero);
                case MSGPACK_CS_FIXEXT_8:
                    again_fixed_trail_if_zero(MSGPACK_ACS_EXT_VALUE, 8+1, _ext_zero);
                case MSGPACK_CS_FIXEXT_16:
                    again_fixed_trail_if_zero(MSGPACK_ACS_EXT_VALUE, 16+1, _ext_zero);
                case MSGPACK_CS_STR_8:
                    again_fixed_trail_if_zero(MSGPACK_ACS_STR_VALUE, *(uint8_t*)n, _str_zero);
                case MSGPACK_CS_BIN_8:
                    again_fixed_trail_if_zero(MSGPACK_ACS_BIN_VALUE, *(uint8_t*)n, _bin_zero);
                case MSGPACK_CS_EXT_8:
                    again_fixed_trail_if_zero(MSGPACK_ACS_EXT_VALUE, (*(uint8_t*)n) + 1, _ext_zero);
                case MSGPACK_CS_STR_16:{
                    uint16_t tmp;
                    _msgpack_load16(uint16_t,n,&tmp);
                    again_fixed_trail_if_zero(MSGPACK_ACS_STR_VALUE, tmp, _str_zero);
                }
                case MSGPACK_CS_BIN_16:{
                    uint16_t tmp;
                    _msgpack_load16(uint16_t,n,&tmp);
                    again_fixed_trail_if_zero(MSGPACK_ACS_BIN_VALUE, tmp, _bin_zero);
                }
                case MSGPACK_CS_EXT_16:{
                    uint16_t tmp;
                    _msgpack_load16(uint16_t,n,&tmp);
                    again_fixed_trail_if_zero(MSGPACK_ACS_EXT_VALUE, tmp + 1, _ext_zero);
                }
                case MSGPACK_CS_STR_32:{
                    uint32_t tmp;
                    _msgpack_load32(uint32_t,n,&tmp);
                    again_fixed_trail_if_zero(MSGPACK_ACS_STR_VALUE, tmp, _str_zero);
                }
                case MSGPACK_CS_BIN_32:{
                    uint32_t tmp;
                    _msgpack_load32(uint32_t,n,&tmp);
                    again_fixed_trail_if_zero(MSGPACK_ACS_BIN_VALUE, tmp, _bin_zero);
                }
                case MSGPACK_CS_EXT_32:{
                    uint32_t tmp;
                    _msgpack_load32(uint32_t,n,&tmp);
                    again_fixed_trail_if_zero(MSGPACK_ACS_EXT_VALUE, tmp + 1, _ext_zero);
                }
                case MSGPACK_ACS_STR_VALUE:
                _str_zero:
                    push_variable_value(_str, data, n, trail);
                case MSGPACK_ACS_BIN_VALUE:
                _bin_zero:
                    push_variable_value(_bin, data, n, trail);
                case MSGPACK_ACS_EXT_VALUE:
                _ext_zero:
                    push_variable_value(_ext, data, n, trail);

                case MSGPACK_CS_ARRAY_16:{
                    uint16_t tmp;
                    _msgpack_load16(uint16_t,n,&tmp);
                    start_container(_array, tmp, MSGPACK_CT_ARRAY_ITEM);
                }
                case MSGPACK_CS_ARRAY_32:{
                    /* FIXME security guard */
                    uint32_t tmp;
                    _msgpack_load32(uint32_t,n,&tmp);
                    start_container(_array, tmp, MSGPACK_CT_ARRAY_ITEM);
                }

                case MSGPACK_CS_MAP_16:{
                    uint16_t tmp;
                    _msgpack_load16(uint16_t,n,&tmp);
                    start_container(_map, tmp, MSGPACK_CT_MAP_KEY);
                }
                case MSGPACK_CS_MAP_32:{
                    /* FIXME security guard */
                    uint32_t tmp;
                    _msgpack_load32(uint32_t,n,&tmp);
                    start_container(_map, tmp, MSGPACK_CT_MAP_KEY);
                }

                default:
                    ret = MSGPACK_UNPACK_PARSE_ERROR;
                    goto _failed;
                }
            }

    _push:
        if(top == 0) { goto _finish; }
        c = &stack[top-1];
        switch(c->ct) {
        case MSGPACK_CT_ARRAY_ITEM:
            ret = msgpack_unpack_callback(_array_item)(user, &c->obj, obj); \
            if(ret < 0) { goto _failed; }
            if(--c->count == 0) {
                obj = c->obj;
                --top;
                /*printf("stack pop %d\n", top);*/
                goto _push;
            }
            goto _header_again;
        case MSGPACK_CT_MAP_KEY:
            c->map_key = obj;
            c->ct = MSGPACK_CT_MAP_VALUE;
            goto _header_again;
        case MSGPACK_CT_MAP_VALUE:
            ret = msgpack_unpack_callback(_map_item)(user, &c->obj, c->map_key, obj); \
            if(ret < 0) { goto _failed; }
            if(--c->count == 0) {
                obj = c->obj;
                --top;
                /*printf("stack pop %d\n", top);*/
                goto _push;
            }
            c->ct = MSGPACK_CT_MAP_KEY;
            goto _header_again;

        default:
            ret = MSGPACK_UNPACK_PARSE_ERROR;
            goto _failed;
        }

    _header_again:
            cs = MSGPACK_CS_HEADER;
            ++p;
        } while(p != pe);
        goto _out;


    _finish:
        stack[0].obj = obj;
        ++p;
        ret = 1;
        /*printf("-- finish --\n"); */
        goto _end;

    _failed:
        /*printf("** FAILED **\n"); */
        goto _end;

    _out:
        ret = 0;
        goto _end;

    _end:
        ctx->cs = cs;
        ctx->trail = trail;
        ctx->top = top;
        *off = (size_t)(p - (const unsigned char*)data);

        return ret;
    }
}